

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O2

ArgumentAndValue * __thiscall
juzzlin::Argengine::Impl::splitAssignmentFormat
          (ArgumentAndValue *__return_storage_ptr__,Impl *this,string *arg)

{
  long lVar1;
  OptionDefinitionSP match;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string assignmentFormatArg;
  
  assignmentFormatArg._M_dataplus._M_p = (pointer)&assignmentFormatArg.field_2;
  assignmentFormatArg._M_string_length = 0;
  assignmentFormatArg.field_2._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::find((char)arg,0x3d);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)arg);
    std::__cxx11::string::operator=((string *)&assignmentFormatArg,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    getOptionDefinition((Impl *)&match,(string *)this);
    if ((match.
         super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr != (element_type *)0x0) &&
       (((match.
          super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->singleStringCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
      if (arg->_M_string_length == lVar1 + 1U) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[1],_true>
                  (__return_storage_ptr__,&assignmentFormatArg,(char (*) [1])0x1150fd);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)arg);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,&assignmentFormatArg,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&match.
                  super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      goto LAB_001130d5;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&match.
                super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
LAB_001130d5:
  std::__cxx11::string::~string((string *)&assignmentFormatArg);
  return __return_storage_ptr__;
}

Assistant:

ArgumentAndValue splitAssignmentFormat(const std::string & arg) const
    {
        std::string assignmentFormatArg;
        if (const auto pos = arg.find('='); pos != arg.npos) {
            assignmentFormatArg = arg.substr(0, pos);
            if (const auto match = getOptionDefinition(assignmentFormatArg); match && match->singleStringCallback) {
                if (const auto valueLength = arg.size() - (pos + 1); !valueLength) {
                    return { assignmentFormatArg, "" };
                } else {
                    return { assignmentFormatArg, arg.substr(pos + 1, valueLength) };
                }
            }
        }
        return {};
    }